

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_stats.hpp
# Opt level: O0

string * __thiscall
duckdb::StringStatisticsState::TruncateMin_abi_cxx11_
          (StringStatisticsState *this,string_t str,idx_t max_size)

{
  ulong uVar1;
  bool bVar2;
  char *pcVar3;
  long in_RSI;
  string *in_RDI;
  ulong in_R8;
  char *str_data;
  string_t *in_stack_ffffffffffffff70;
  allocator local_49;
  char *local_48;
  allocator local_29;
  ulong local_28;
  
  local_28 = in_R8;
  if (*(char *)(in_RSI + 8) == '\x1a') {
    pcVar3 = string_t::GetData(in_stack_ffffffffffffff70);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,pcVar3,local_28,&local_29);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    local_48 = string_t::GetData(in_stack_ffffffffffffff70);
    while ((local_28 != 0 && (bVar2 = IsCharacter(local_48[local_28]), !bVar2))) {
      local_28 = local_28 - 1;
    }
    uVar1 = local_28;
    pcVar3 = local_48;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,pcVar3,uVar1,&local_49);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return in_RDI;
}

Assistant:

string TruncateMin(string_t str, idx_t max_size) {
		// truncate a string for the min value
		// since 'AAA' < 'AAAA', we can just truncate the string
		D_ASSERT(str.GetSize() > max_size);
		if (type == LogicalTypeId::BLOB) {
			// for blobs - just truncate directly
			return string(str.GetData(), max_size);
		}
		D_ASSERT(type == LogicalTypeId::VARCHAR);
		// for varchar we need to truncate to a valid UTF8 string - so we need to truncate to the last valid UTF8 byte
		auto str_data = str.GetData();
		for (; max_size > 0; max_size--) {
			if (IsCharacter(str_data[max_size])) {
				break;
			}
		}
		return string(str_data, max_size);
	}